

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O3

int __thiscall coda_url::assign_anchor(coda_url *this,char *beg,uint32_t flags)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  size_t len;
  
  pcVar3 = coda_strnchr(this->val_str,'#',(ulong)this->val_len);
  if (pcVar3 == (char *)0x0) {
    uVar2 = this->val_len;
  }
  else {
    uVar2 = (int)pcVar3 - (int)this->val_str;
    this->val_len = uVar2;
  }
  pcVar4 = coda_strnchr(beg,'/',(size_t)(this->val_str + ((ulong)uVar2 - (long)beg)));
  pcVar3 = this->val_str + this->val_len;
  if (pcVar4 != (char *)0x0) {
    pcVar3 = pcVar4;
  }
  pcVar4 = beg;
  pcVar7 = beg;
  if (beg < pcVar3) {
    do {
      uVar2 = tolower((int)*pcVar7);
      cVar1 = (char)uVar2;
      *pcVar7 = cVar1;
      if ((((9 < (byte)(cVar1 - 0x30U)) && (0x19 < (byte)(cVar1 + 0xbfU))) &&
          (0x19 < (int)cVar1 - 0x61U)) &&
         ((uVar2 = (uVar2 & 0xff) - 0x2d, pcVar4 = pcVar7, 0x32 < uVar2 ||
          ((0x4000000002003U >> ((ulong)uVar2 & 0x3f) & 1) == 0)))) break;
      pcVar7 = pcVar7 + 1;
      pcVar4 = pcVar3;
    } while (pcVar7 != pcVar3);
  }
  if (pcVar3 == pcVar4) {
    pcVar4 = this->val_str + this->val_len;
    if (pcVar4 == pcVar3) {
      this->val_len = this->val_len + 1;
      *pcVar4 = '/';
      pcVar3 = pcVar4;
    }
  }
  else {
    memmove(pcVar4 + 1,pcVar4,(size_t)(this->val_str + ((ulong)this->val_len - (long)pcVar4)));
    *pcVar4 = '/';
    this->val_len = this->val_len + 1;
    pcVar3 = pcVar4;
  }
  len = (long)pcVar3 - (long)beg;
  sVar5 = coda_strnspn(beg,".",len);
  if (sVar5 != 0) {
    memmove(beg,beg + sVar5,(size_t)(this->val_str + ((ulong)this->val_len - (long)(beg + sVar5))));
    this->val_len = this->val_len - (int)sVar5;
    pcVar3 = pcVar3 + -sVar5;
    len = (long)pcVar3 - (long)beg;
  }
  sVar5 = coda_revnspn(beg,".",len);
  if (sVar5 != 0) {
    memmove(pcVar3 + (1 - sVar5),pcVar3,
            (size_t)(this->val_str + ((ulong)this->val_len - (long)pcVar3)));
    lVar6 = (long)pcVar3 - (long)(pcVar3 + (1 - sVar5));
    this->val_len = this->val_len - (int)lVar6;
    pcVar3 = pcVar3 + -lVar6;
  }
  pcVar4 = coda_revnchr(beg,'.',(size_t)(pcVar3 + ~(ulong)beg));
  if (pcVar4 == (char *)0x0) {
    pcVar4 = beg + -1;
  }
  pcVar4 = coda_revnchr(beg,'.',(size_t)(pcVar4 + ~(ulong)beg));
  if (pcVar4 == (char *)0x0) {
    pcVar4 = beg + -1;
  }
  this->dom_str = pcVar4 + 1;
  this->dom_len = (int)pcVar3 - (int)(pcVar4 + 1);
  assign_refers(this,pcVar3,flags);
  return 0;
}

Assistant:

int coda_url::assign_anchor(char *beg, uint32_t flags)
{
	char *p;
	char *end;

	if (NULL != (end = coda_strnchr(val_str, '#', val_len)))
	{
		val_len = end - val_str;
	}

	end = coda_strnchr(beg, '/', val_str + val_len - beg);
	if (NULL == end) end = val_str + val_len;

	for (p = beg; p < end; ++p)
	{
		*p = tolower(*p);

		if (!DOMAIN_SYMBOL(*p))
		{
			break;
		}
	}

	if (end == p)
	{
		if (val_str + val_len == end)
		{
			end = val_str + val_len;
			val_str[val_len++] = '/';
		}
	}
	else
	{
		memmove(p + 1, p, val_str + val_len - p);
		end = p; p[0] = '/'; val_len++;
	}

	if (beg != (p = beg + coda_strnspn(beg, ".", end - beg)))
	{
		memmove(beg, p, val_str + val_len - p);
		val_len -= p - beg;
			end -= p - beg;
	}

	if (end != (p = end - coda_revnspn(beg, ".", end - beg)))
	{
		memmove(p + 1, end, val_str + val_len - end);
		val_len -= end - (p + 1);
			end -= end - (p + 1);
	}

	p = end;

	if (NULL == (p = coda_revnchr(beg, '.', (p - 1) - beg))) p = beg - 1;
	if (NULL == (p = coda_revnchr(beg, '.', (p - 1) - beg))) p = beg - 1;

	dom_str = p + 1;
	dom_len = end - (p + 1);

	return assign_refers(end, flags);
}